

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

bool __thiscall
libcellml::Validator::ValidatorImpl::checkIssuesForDuplications
          (ValidatorImpl *this,string *description)

{
  long lVar1;
  __type _Var2;
  size_t sVar3;
  long lVar4;
  Logger local_60;
  string local_50;
  
  sVar3 = Logger::issueCount(&this->mValidator->super_Logger);
  lVar1 = 0;
  do {
    lVar4 = lVar1;
    if (-lVar4 == sVar3) break;
    Logger::issue(&local_60,(size_t)this->mValidator);
    Issue::description_abi_cxx11_(&local_50,(Issue *)local_60._vptr_Logger);
    _Var2 = std::operator==(&local_50,description);
    std::__cxx11::string::~string((string *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60.mPimpl);
    lVar1 = lVar4 + -1;
  } while (!_Var2);
  return (ulong)-lVar4 < sVar3;
}

Assistant:

bool Validator::ValidatorImpl::checkIssuesForDuplications(const std::string &description) const
{
    size_t count = mValidator->issueCount();
    for (size_t i = 0; i < count; ++i) {
        if (mValidator->issue(count - 1 - i)->description() == description) {
            return true;
        }
    }
    return false;
}